

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_measurement *
units::measurement_from_string
          (precise_measurement *__return_storage_ptr__,string *measurement_string,
          uint64_t match_flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  unit_data uVar4;
  ulong match_flags_00;
  precise_unit pVar5;
  precise_unit c;
  size_t loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  precise_measurement mstr;
  double local_110;
  precise_unit local_f8;
  size_t local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  double local_80;
  double local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (measurement_string->_M_string_length == 0) {
    __return_storage_ptr__->value_ = 0.0;
    (__return_storage_ptr__->units_).multiplier_ = 1.0;
    (__return_storage_ptr__->units_).base_units_ = (unit_data)0x0;
    (__return_storage_ptr__->units_).commodity_ = 0;
    return __return_storage_ptr__;
  }
  match_flags_00 = match_flags & 0xffffffefffffffff;
  cleanUnitString(measurement_string,match_flags_00);
  local_e8 = 0;
  local_110 = generateLeadingNumber(measurement_string,&local_e8);
  if (local_e8 == 0) {
    local_110 = readNumericalWords(measurement_string,&local_e8);
  }
  sVar2 = local_e8;
  if (local_e8 == 0) {
    local_110 = 1.0;
  }
  if (measurement_string->_M_string_length <= local_e8) {
    __return_storage_ptr__->value_ = local_110;
    (__return_storage_ptr__->units_).multiplier_ = (double)0x3ff0000000000000;
    (__return_storage_ptr__->units_).base_units_ = (unit_data)0x0;
    (__return_storage_ptr__->units_).commodity_ = 0;
    return __return_storage_ptr__;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_e0,measurement_string,local_e8,0xffffffffffffffff);
  bVar3 = checkValidUnitString(&local_e0,match_flags_00);
  if (bVar3) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      local_a0.field_2._8_8_ = local_e0.field_2._8_8_;
    }
    else {
      local_a0._M_dataplus._M_p = local_e0._M_dataplus._M_p;
    }
    local_a0.field_2._M_allocated_capacity._1_7_ = local_e0.field_2._M_allocated_capacity._1_7_;
    local_a0.field_2._M_local_buf[0] = local_e0.field_2._M_local_buf[0];
    local_a0._M_string_length = local_e0._M_string_length;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    pVar5 = unit_from_string_internal(&local_a0,match_flags | 0x1000000000);
  }
  else {
    pVar5.base_units_ = (unit_data)0xfa94a488;
    pVar5.commodity_ = 0;
    pVar5.multiplier_ = NAN;
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (pVar5.base_units_ == (unit_data)0xfa94a488 || NAN(pVar5.multiplier_)) {
    if (sVar2 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 measurement_string,0,1);
      local_f8 = get_unit((string *)local_c0,match_flags_00);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,
                        CONCAT44(local_b0._M_allocated_capacity._4_4_,
                                 local_b0._M_allocated_capacity._0_4_) + 1);
      }
      bVar3 = precise_unit::operator==(&local_f8,(precise_unit *)precise::currency);
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,measurement_string,1,0xffffffffffffffff);
        measurement_from_string((precise_measurement *)local_c0,&local_50,match_flags_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_78 = (double)local_c0._8_8_;
        local_80 = local_f8.multiplier_;
        uVar4 = detail::unit_data::operator*((unit_data *)(local_c0 + 0x10),&local_f8.base_units_);
        __return_storage_ptr__->value_ = (double)local_c0._0_8_;
        (__return_storage_ptr__->units_).multiplier_ = local_78 * local_80;
        (__return_storage_ptr__->units_).base_units_ = uVar4;
        (__return_storage_ptr__->units_).commodity_ =
             local_f8.commodity_ | local_b0._M_allocated_capacity._4_4_;
        if (bVar3) goto LAB_0040684f;
      }
    }
    local_70._M_dataplus._M_p = (measurement_string->_M_dataplus)._M_p;
    paVar1 = &measurement_string->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar1) {
      local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&measurement_string->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_70._M_string_length = measurement_string->_M_string_length;
    (measurement_string->_M_dataplus)._M_p = (pointer)paVar1;
    measurement_string->_M_string_length = 0;
    (measurement_string->field_2)._M_local_buf[0] = '\0';
    pVar5 = unit_from_string_internal(&local_70,match_flags | 0x1000000000);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar5 & (undefined1  [16])0xfffffff) == (undefined1  [16])0x0 ||
        pVar5.base_units_ == (unit_data)0xfa94a488 && NAN(pVar5.multiplier_)) {
      __return_storage_ptr__->value_ = local_110;
      (__return_storage_ptr__->units_).multiplier_ = NAN;
      (__return_storage_ptr__->units_).base_units_ = (unit_data)0xfa94a488;
      (__return_storage_ptr__->units_).commodity_ = 0;
    }
    else {
      __return_storage_ptr__->value_ = 1.0;
      __return_storage_ptr__->units_ = pVar5;
    }
  }
  else if ((sVar2 == 0) && (pVar5.base_units_ == (unit_data)0x1000000)) {
    __return_storage_ptr__->value_ = pVar5.multiplier_;
    (__return_storage_ptr__->units_).multiplier_ = 1.0;
    (__return_storage_ptr__->units_).base_units_ = (unit_data)0x1000000;
    (__return_storage_ptr__->units_).commodity_ = pVar5.commodity_;
  }
  else {
    __return_storage_ptr__->value_ = local_110;
    __return_storage_ptr__->units_ = pVar5;
  }
LAB_0040684f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

precise_measurement measurement_from_string(
    std::string measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // do a cleaning first to get rid of spaces and other issues
    match_flags &= (~skip_code_replacements);
    cleanUnitString(measurement_string, match_flags);

    size_t loc{0};
    auto val = generateLeadingNumber(measurement_string, loc);
    if (loc == 0) {
        val = readNumericalWords(measurement_string, loc);
    }
    if (loc == 0) {
        val = 1.0;
    }
    if (loc >= measurement_string.length()) {
        return {val, precise::one};
    }
    bool checkCurrency = (loc == 0);
    auto ustring = measurement_string.substr(loc);
    auto validString = checkValidUnitString(ustring, match_flags);
    auto un = (validString) ?
        unit_from_string_internal(
            std::move(ustring), match_flags | skip_code_replacements) :
        precise::invalid;
    if (!is_error(un)) {
        if (checkCurrency) {
            if (un.base_units() == precise::currency.base_units()) {
                return {
                    un.multiplier(),
                    precise_unit(1.0, precise::currency, un.commodity())};
            }
        }
        return {val, un};
    }
    if (checkCurrency) {
        auto c = get_unit(measurement_string.substr(0, 1), match_flags);
        if (c == precise::currency) {
            auto mstr = measurement_from_string(
                measurement_string.substr(1), match_flags);
            return mstr * c;
        }
    }

    // deal with some specifics
    /*
    if (measurement_string[loc] == '\'')
    {
        double v2 = std::stod(measurement_string.substr(loc + 1), &loc);
        if (measurement_string[loc] == '"')
        {
            return precise_measurement(val, precise::ft) +
    precise_measurement(v2, precise::in);
        }
    }
    */
    auto unit = unit_from_string_internal(
        std::move(measurement_string), match_flags | skip_code_replacements);
    if (is_valid(unit) && !unit.has_same_base(one.base_units())) {
        return {1.0, unit};
    }
    return {val, precise::invalid};
}